

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O2

int __thiscall Qclass::futurereward(Qclass *this,int new_state)

{
  double dVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  
  iVar2 = -100000;
  if (new_state < 0x9c4) {
    dVar4 = -100000.0;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      dVar1 = this->Q[new_state][lVar3];
      if (dVar1 <= dVar4) {
        dVar1 = dVar4;
      }
      dVar4 = dVar1;
    }
    iVar2 = (int)dVar4;
  }
  return iVar2;
}

Assistant:

int Qclass::futurereward(int new_state) {
  double currMax = -100000;
  if (new_state > 2499) {
    currMax = -100000;
  } else {   // Finds future reward benefits for state,action pair
    for (int i = 0; i < 4; i++) {
      if (Q[new_state][i] > currMax) {
        currMax = Q[new_state][i];
      }
    }
  }
  return currMax;
}